

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_reporter_tests.c
# Opt level: O3

void setup_xml_reporter_tests(void)

{
  int iVar1;
  TestReporter *pTVar2;
  
  reporter = (TestReporter *)create_libxml_reporter("PREFIX");
  iVar1 = start_cgreen_messaging(0x29b);
  pTVar2 = reporter;
  reporter->ipc = iVar1;
  if (output != (xmlChar *)0x0) {
    (*_xmlFree)(output);
    pTVar2 = reporter;
  }
  output = (xmlChar *)0x0;
  set_libxml_reporter_printer(pTVar2,mocked_xmlout);
  return;
}

Assistant:

static void setup_xml_reporter_tests(void) {
    reporter = create_xml_reporter("PREFIX");

    // We can not use setup_reporting() since we are running
    // inside a test suite which needs the real reporting
    // So we'll have to set up the messaging explicitly
    reporter->ipc = start_cgreen_messaging(667);

    clear_output();
    set_xml_reporter_printer(reporter, mocked_printf);
}